

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O3

bool CountHighbitsCollisions<unsigned_long>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes,int nbHBits)

{
  pointer puVar1;
  byte bVar2;
  undefined8 uVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar17 [64];
  undefined1 auVar11 [32];
  undefined1 auVar10 [32];
  
  bVar5 = true;
  if (nbHBits < 0x40) {
    uVar8 = (long)(hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    auVar20._0_8_ = (double)(int)uVar8;
    dVar18 = ldexp(1.0,nbHBits);
    auVar19._0_8_ = (auVar20._0_8_ * (double)((int)uVar8 + -1)) / dVar18;
    auVar19._8_8_ = 0;
    auVar20._8_8_ = 0;
    auVar19 = vminsd_avx(auVar20,auVar19);
    printf("Testing collisions (high %2i-bit) - Expected %12.1f, ",(ulong)(uint)nbHBits);
    uVar7 = 0;
    if (1 < uVar8) {
      auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      puVar1 = (hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      auVar13 = vpbroadcastq_avx512f();
      uVar6 = 0;
      auVar14 = vpbroadcastq_avx512f();
      auVar15 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar21 = auVar15;
        auVar15 = vpbroadcastq_avx512f();
        auVar15 = vporq_avx512f(auVar15,auVar12);
        uVar4 = vpcmpuq_avx512f(auVar15,auVar14,2);
        auVar15 = vmovdqu64_avx512f(*(undefined1 (*) [64])(puVar1 + uVar6));
        bVar2 = (byte)uVar4;
        auVar16._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar15._8_8_;
        auVar16._0_8_ = (ulong)(bVar2 & 1) * auVar15._0_8_;
        auVar16._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar15._16_8_;
        auVar16._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar15._24_8_;
        auVar16._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar15._32_8_;
        auVar16._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar15._40_8_;
        auVar16._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar15._48_8_;
        auVar16._56_8_ = (uVar4 >> 7) * auVar15._56_8_;
        auVar15 = vpsrlvq_avx512f(auVar16,auVar13);
        auVar16 = vmovdqu64_avx512f(*(undefined1 (*) [64])(puVar1 + uVar6 + 1));
        auVar17._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar16._8_8_;
        auVar17._0_8_ = (ulong)(bVar2 & 1) * auVar16._0_8_;
        auVar17._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar16._16_8_;
        auVar17._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar16._24_8_;
        auVar17._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar16._32_8_;
        auVar17._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar16._40_8_;
        auVar17._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar16._48_8_;
        auVar17._56_8_ = (uVar4 >> 7) * auVar16._56_8_;
        uVar6 = uVar6 + 8;
        auVar16 = vpsrlvq_avx512f(auVar17,auVar13);
        uVar3 = vpcmpeqq_avx512f(auVar15,auVar16);
        auVar10 = vpmovm2d_avx512vl(uVar3);
        auVar10 = vpsubd_avx2(auVar21._0_32_,auVar10);
        auVar15 = ZEXT3264(auVar10);
      } while ((uVar8 + 6 & 0xfffffffffffffff8) != uVar6);
      auVar10 = vmovdqa32_avx512vl(auVar10);
      auVar9._0_4_ = (uint)(bVar2 & 1) * auVar10._0_4_ | (uint)!(bool)(bVar2 & 1) * auVar21._0_4_;
      bVar5 = (bool)((byte)(uVar4 >> 1) & 1);
      auVar9._4_4_ = (uint)bVar5 * auVar10._4_4_ | (uint)!bVar5 * auVar21._4_4_;
      bVar5 = (bool)((byte)(uVar4 >> 2) & 1);
      auVar9._8_4_ = (uint)bVar5 * auVar10._8_4_ | (uint)!bVar5 * auVar21._8_4_;
      bVar5 = (bool)((byte)(uVar4 >> 3) & 1);
      auVar9._12_4_ = (uint)bVar5 * auVar10._12_4_ | (uint)!bVar5 * auVar21._12_4_;
      bVar5 = (bool)((byte)(uVar4 >> 4) & 1);
      auVar11._16_4_ = (uint)bVar5 * auVar10._16_4_ | (uint)!bVar5 * auVar21._16_4_;
      auVar11._0_16_ = auVar9;
      bVar5 = (bool)((byte)(uVar4 >> 5) & 1);
      auVar11._20_4_ = (uint)bVar5 * auVar10._20_4_ | (uint)!bVar5 * auVar21._20_4_;
      bVar5 = (bool)((byte)(uVar4 >> 6) & 1);
      auVar11._24_4_ = (uint)bVar5 * auVar10._24_4_ | (uint)!bVar5 * auVar21._24_4_;
      bVar5 = SUB81(uVar4 >> 7,0);
      auVar11._28_4_ = (uint)bVar5 * auVar10._28_4_ | (uint)!bVar5 * auVar21._28_4_;
      auVar20 = vphaddd_avx(auVar11._16_16_,auVar9);
      auVar20 = vphaddd_avx(auVar20,auVar20);
      auVar20 = vphaddd_avx(auVar20,auVar20);
      uVar7 = auVar20._0_4_;
    }
    dVar18 = (double)(int)uVar7 / auVar19._0_8_;
    printf("actual %6i (%.2fx)",(ulong)uVar7);
    if ((0.98 < dVar18) && (uVar7 = uVar7 - (int)auVar19._0_8_, uVar7 != 0)) {
      printf(" (%i)",(ulong)uVar7);
    }
    if (2.0 < dVar18) {
      puts(" !!!!!");
    }
    else {
      putchar(10);
    }
    bVar5 = 2.0 >= dVar18;
  }
  return bVar5;
}

Assistant:

bool CountHighbitsCollisions ( std::vector<hashtype> & hashes, int nbHBits)
{
  int origBits = sizeof(hashtype) * 8;
  int shiftBy = origBits - nbHBits;

  if (shiftBy <= 0) return true;

  size_t const nbH = hashes.size();
  double expected = EstimateNbCollisions(nbH, nbHBits);
  printf("Testing collisions (high %2i-bit) - Expected %12.1f, ", nbHBits, expected);
  int collcount = 0;

  for (size_t hnb = 1; hnb < nbH; hnb++)
  {
#ifdef DEBUG
    hashtype const h1x = hashes[hnb-1];
    hashtype const h2x = hashes[hnb];
#endif
    hashtype const h1 = hashes[hnb-1] >> shiftBy;
    hashtype const h2 = hashes[hnb]   >> shiftBy;
    if(h1 == h2)
      collcount++;
  }

  printf("actual %6i (%.2fx)", collcount, collcount / expected);
  if (collcount/expected > 0.98 && collcount != (int)expected)
    printf(" (%i)", collcount - (int)expected);

  if(double(collcount) / double(expected) > 2.0)
  {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}